

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int domonability(void)

{
  boolean bVar1;
  monst *pmVar2;
  int local_c;
  
  bVar1 = attacktype(youmonst.data,0xc);
  if (bVar1 == '\0') {
    bVar1 = attacktype(youmonst.data,10);
    if (bVar1 == '\0') {
      if ((youmonst.data)->mlet == '\x0e') {
        local_c = doremove();
      }
      else {
        bVar1 = attacktype(youmonst.data,0xf);
        if (bVar1 == '\0') {
          if (((youmonst.data)->mflags2 & 4) == 0) {
            if ((youmonst.data == mons + 0x62) || (youmonst.data == mons + 100)) {
              local_c = dospinweb();
            }
            else if (((youmonst.data)->mflags1 & 0x100) == 0) {
              if ((youmonst.data == mons + 0x31) || (youmonst.data == mons + 0x32)) {
                local_c = domindblast();
              }
              else {
                if (u.umonnum == 0x29) {
                  if (level->locations[u.ux][u.uy].typ == '\x1c') {
                    pmVar2 = split_mon(&youmonst,(monst *)0x0);
                    if (pmVar2 != (monst *)0x0) {
                      dryup(u.ux,u.uy,'\x01');
                    }
                  }
                  else {
                    pline("There is no fountain here.");
                  }
                }
                else {
                  if (((youmonst.data)->mlet == '\x15') &&
                     (((youmonst.data)->mflags2 & 0x20000000) != 0)) {
                    fix_attributes_and_properties((obj *)0x0,0);
                    return 1;
                  }
                  if ((youmonst.data)->msound == '\x0f') {
                    pline("You shriek.");
                    if (((byte)u._1052_1_ >> 5 & 1) == 0) {
                      aggravate();
                    }
                    else {
                      pline("Unfortunately sound does not carry well through rock.");
                    }
                  }
                  else if (u.umonnum == u.umonster) {
                    pline("You don\'t have a special ability in your normal form!");
                  }
                  else {
                    pline("Any special ability you may have is purely reflexive.");
                  }
                }
                local_c = 0;
              }
            }
            else {
              local_c = dohide();
            }
          }
          else {
            local_c = dosummon();
          }
        }
        else {
          local_c = dogaze();
        }
      }
    }
    else {
      local_c = dospit();
    }
  }
  else {
    local_c = dobreathe();
  }
  return local_c;
}

Assistant:

static int domonability(void)
{
	if (can_breathe(youmonst.data)) return dobreathe();
	else if (attacktype(youmonst.data, AT_SPIT)) return dospit();
	else if (youmonst.data->mlet == S_NYMPH) return doremove();
	else if (attacktype(youmonst.data, AT_GAZE)) return dogaze();
	else if (is_were(youmonst.data)) return dosummon();
	else if (webmaker(youmonst.data)) return dospinweb();
	else if (is_hider(youmonst.data)) return dohide();
	else if (is_mind_flayer(youmonst.data)) return domindblast();
	else if (u.umonnum == PM_GREMLIN) {
	    if (IS_FOUNTAIN(level->locations[u.ux][u.uy].typ)) {
		if (split_mon(&youmonst, NULL))
		    dryup(u.ux, u.uy, TRUE);
	    } else pline("There is no fountain here.");
	} else if (is_unicorn(youmonst.data)) {
	    fix_attributes_and_properties(NULL, 0);
	    return 1;
	} else if (youmonst.data->msound == MS_SHRIEK) {
	    pline("You shriek.");
	    if (u.uburied)
		pline("Unfortunately sound does not carry well through rock.");
	    else aggravate();
	} else if (Upolyd)
		pline("Any special ability you may have is purely reflexive.");
	else pline("You don't have a special ability in your normal form!");
	return 0;
}